

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
::write_decimal<long_long>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
           *this,longlong value)

{
  type_conflict4 tVar1;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *this_00;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> bVar2;
  uint64_t in_RSI;
  basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>,_wchar_t>_>
  *in_RDI;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *it;
  int num_digits;
  bool is_negative;
  main_type abs_value;
  value_type_conflict *in_stack_ffffffffffffffa8;
  unsigned_long in_stack_ffffffffffffffc0;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> in_stack_ffffffffffffffc8;
  uint64_t local_18;
  
  tVar1 = internal::is_negative<long_long>(in_RSI);
  local_18 = in_RSI;
  if (tVar1) {
    local_18 = -in_RSI;
  }
  internal::count_digits(local_18);
  this_00 = reserve(in_RDI,(size_t)in_stack_ffffffffffffffa8);
  if (tVar1) {
    in_stack_ffffffffffffffc8 =
         std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>::operator++
                   (this_00,0);
    std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>::operator*
              ((back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *)
               &stack0xffffffffffffffc8);
    std::back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>::operator=
              (&in_RDI->out_,in_stack_ffffffffffffffa8);
  }
  bVar2 = internal::
          format_decimal<wchar_t,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,unsigned_long>
                    (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                     (int)((ulong)this_00->container >> 0x20));
  this_00->container = bVar2.container;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }